

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O3

void __thiscall
fasttext::QuantMatrix::averageRowsToVector
          (QuantMatrix *this,Vector *x,vector<int,_std::allocator<int>_> *rows)

{
  uint *puVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  
  Vector::zero(x);
  auVar3 = in_ZMM0._0_16_;
  puVar1 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  puVar2 = puVar1;
  if (puVar1 != (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish) {
    do {
      (*(this->super_Matrix)._vptr_Matrix[4])(this,x,(ulong)*puVar2);
      auVar3 = in_ZMM0._0_16_;
      puVar2 = puVar2 + 1;
    } while (puVar2 != (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish);
    puVar1 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
  }
  auVar3 = vcvtusi2sd_avx512f(auVar3,(long)puVar2 - (long)puVar1 >> 2);
  Vector::mul(x,(float)(1.0 / auVar3._0_8_));
  return;
}

Assistant:

void QuantMatrix::averageRowsToVector(Vector& x, const std::vector<int32_t>& rows) const {
  x.zero();
  for (auto it = rows.cbegin(); it != rows.cend(); ++it) {
    addRowToVector(x, *it);
  }
  x.mul(1.0 / rows.size());
}